

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O0

bool __thiscall mylanguage_driver::parse_file(mylanguage_driver *this,cstref filename,ostream *out)

{
  byte bVar1;
  istream local_230 [8];
  ifstream in;
  ostream *out_local;
  cstref filename_local;
  mylanguage_driver *this_local;
  
  std::ifstream::ifstream(local_230,(string *)filename,_S_in);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = parse_stream(this,local_230,filename,(ostream *)&std::cout);
  }
  std::ifstream::~ifstream(local_230);
  return this_local._7_1_;
}

Assistant:

bool mylanguage_driver::parse_file(cstref filename, std::ostream& out)
{
    ifstream in(filename);
    if(!in.good()) return false;
    return parse_stream(in, filename);
}